

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEDate.cpp
# Opt level: O0

bool __thiscall test_CEDate::test_Gregorian(test_CEDate *this)

{
  double dVar1;
  initializer_list<double> __l;
  byte bVar2;
  reference pvVar3;
  vector *in_RDI;
  double test_greg;
  double test_mjd;
  double test_jd;
  vector<double,_std::allocator<double>_> greg_vec2;
  CEDate test1;
  vector<double,_std::allocator<double>_> greg_vec;
  undefined7 in_stack_fffffffffffff9e8;
  undefined1 in_stack_fffffffffffff9ef;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9f8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa00;
  allocator *this_00;
  iterator in_stack_fffffffffffffa08;
  CEDate *in_stack_fffffffffffffa10;
  allocator *paVar4;
  vector<double,_std::allocator<double>_> *gregorian;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa28;
  CEDate *in_stack_fffffffffffffa30;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa38;
  vector<double,_std::allocator<double>_> *pvVar5;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa40;
  vector<double,_std::allocator<double>_> *pvVar6;
  CEDateType *in_stack_fffffffffffffab0;
  double *in_stack_fffffffffffffab8;
  CEDate *in_stack_fffffffffffffac0;
  double dVar7;
  undefined4 local_4e8;
  allocator local_4e1;
  string local_4e0 [56];
  double local_4a8;
  undefined4 local_4a0;
  allocator local_499;
  string local_498 [56];
  double local_460;
  undefined4 local_458;
  allocator local_451;
  string local_450 [56];
  double local_418 [3];
  vector<double,_std::allocator<double>_> *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d8;
  undefined8 local_3d0;
  undefined4 local_3c8;
  allocator local_3c1;
  string local_3c0 [32];
  double local_3a0 [4];
  vector<double,_std::allocator<double>_> *local_380;
  undefined4 local_378;
  allocator local_371;
  string local_370 [32];
  undefined8 local_350 [4];
  double local_330;
  undefined4 local_328;
  allocator local_321;
  string local_320 [32];
  undefined8 local_300 [4];
  double local_2e0;
  undefined4 local_2d8;
  allocator local_2d1;
  string local_2d0 [32];
  undefined8 local_2b0 [4];
  double local_290;
  vector<double,_std::allocator<double>_> local_288;
  vector<double,_std::allocator<double>_> local_270;
  undefined4 local_258;
  allocator local_251;
  string local_250 [32];
  vector local_230 [48];
  undefined4 local_200;
  allocator local_1f9;
  string local_1f8 [32];
  CEDate local_1d8;
  string local_198 [24];
  undefined4 local_180;
  allocator local_179;
  string local_178 [32];
  string local_158 [24];
  vector local_140 [24];
  undefined4 local_128;
  allocator local_121;
  string local_120 [32];
  double local_100;
  double local_f8;
  undefined4 local_f0;
  allocator local_e9;
  string local_e8 [32];
  int local_c8;
  int local_c4 [2];
  allocator local_b9;
  string local_b8 [32];
  int local_98;
  int local_94 [2];
  allocator local_89;
  string local_88 [32];
  int local_68;
  int local_64 [6];
  allocator local_49;
  string local_48 [32];
  double local_28;
  double local_20;
  undefined4 local_14;
  double local_10;
  
  local_10 = CEDate::Gregorian((CEDate *)(in_RDI + 0x220));
  local_14 = 2;
  CEDate::SetDate(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  local_20 = CEDate::Gregorian((CEDate *)(in_RDI + 0x260));
  local_28 = CEDate::Gregorian((CEDate *)(in_RDI + 0x220));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"test_Gregorian",&local_49);
  local_64[1] = 0x7d;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_20,&local_28,local_48,local_64 + 1);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_64[0] = CEDate::Year((CEDate *)0x11dd20);
  local_68 = CEDate::Year((CEDate *)0x11dd3b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"test_Gregorian",&local_89);
  local_94[1] = 0x80;
  (**(code **)(*(long *)in_RDI + 0x60))(in_RDI,local_64,&local_68,local_88,local_94 + 1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_94[0] = CEDate::Month((CEDate *)0x11dde1);
  local_98 = CEDate::Month((CEDate *)0x11ddfc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"test_Gregorian",&local_b9);
  local_c4[1] = 0x81;
  (**(code **)(*(long *)in_RDI + 0x60))(in_RDI,local_94,&local_98,local_b8,local_c4 + 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_c4[0] = CEDate::Day((CEDate *)0x11dea2);
  local_c8 = CEDate::Day((CEDate *)0x11debd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"test_Gregorian",&local_e9);
  local_f0 = 0x82;
  (**(code **)(*(long *)in_RDI + 0x60))(in_RDI,local_c4,&local_c8,local_e8,&local_f0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_f8 = CEDate::DayFraction((CEDate *)0x11df63);
  local_100 = CEDate::DayFraction((CEDate *)0x11df80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"test_Gregorian",&local_121);
  local_128 = 0x83;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_f8,&local_100,local_120,&local_128);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  CEDate::GregorianVect((CEDate *)CONCAT17(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9e8));
  CEDate::GregorianVect((CEDate *)CONCAT17(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9e8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"test_Gregorian",&local_179);
  local_180 = 0x86;
  CETestSuite::test_vect(in_RDI,local_140,local_158,(int *)local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  CEDate::GregorianVect((CEDate *)CONCAT17(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9e8));
  CEDate::CurrentJD();
  CEDate::CEDate(in_stack_fffffffffffffa10,(double)in_stack_fffffffffffffa08,
                 (CEDateType)((ulong)in_stack_fffffffffffffa00 >> 0x20));
  dVar7 = CEDate::JD(&local_1d8);
  dVar1 = CEDate::JD((CEDate *)(in_RDI + 0x220));
  paVar4 = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"test_Gregorian",paVar4);
  local_200 = 0x8b;
  (**(code **)(*(long *)in_RDI + 0x48))(in_RDI,-(dVar7 != dVar1) & 1,local_1f8,&local_200);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  CEDate::SetDate(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  CEDate::GregorianVect((CEDate *)CONCAT17(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9e8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"test_Gregorian",&local_251);
  local_258 = 0x8d;
  CETestSuite::test_vect(in_RDI,local_230,local_198,(int *)local_250);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  CEDate::GregorianVect((CEDate *)CONCAT17(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9e8));
  pvVar6 = &local_270;
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  pvVar5 = &local_288;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,0);
  *pvVar3 = -50000.0;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  local_290 = CEDate::GregorianVect2JD(in_stack_fffffffffffffa28);
  local_2b0[0] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"test_Gregorian",&local_2d1);
  local_2d8 = 0x94;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_290,local_2b0,local_2d0,&local_2d8);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  std::vector<double,_std::allocator<double>_>::operator=(pvVar6,pvVar5);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_288,1);
  *pvVar3 = -1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  local_2e0 = CEDate::GregorianVect2JD(in_stack_fffffffffffffa28);
  local_300[0] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"test_Gregorian",&local_321);
  local_328 = 0x98;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_2e0,local_300,local_320,&local_328);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_288,1);
  *pvVar3 = 13.0;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  local_330 = CEDate::GregorianVect2JD(in_stack_fffffffffffffa28);
  local_350[0] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"test_Gregorian",&local_371);
  local_378 = 0x9a;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_330,local_350,local_370,&local_378);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  std::vector<double,_std::allocator<double>_>::operator=(pvVar6,pvVar5);
  pvVar6 = &local_288;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,2);
  *pvVar3 = *pvVar3 + 100.0;
  std::vector<double,_std::allocator<double>_>::vector(pvVar6,in_stack_fffffffffffffa38);
  pvVar5 = (vector<double,_std::allocator<double>_> *)
           CEDate::GregorianVect2JD(in_stack_fffffffffffffa28);
  local_380 = pvVar5;
  local_3a0[0] = CEDate::JD((CEDate *)(in_RDI + 0x220));
  local_3a0[0] = local_3a0[0] + 100.0;
  paVar4 = &local_3c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"test_Gregorian",paVar4);
  local_3c8 = 0x9e;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_380,local_3a0,local_3c0,&local_3c8);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  local_3e8 = 0x3ff0000000000000;
  uStack_3e0 = 0x3fe0000000000000;
  local_3f8 = 0x409f400000000000;
  uStack_3f0 = 0x3ff0000000000000;
  local_3d8 = &local_3f8;
  local_3d0 = 4;
  __l._M_len = (size_type)in_stack_fffffffffffffa10;
  __l._M_array = in_stack_fffffffffffffa08;
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_fffffffffffffa00,__l);
  gregorian = (vector<double,_std::allocator<double>_> *)CppEphem::julian_date_J2000();
  local_418[2] = (double)gregorian + -2400000.5;
  local_418[1] = 20000101.5;
  local_400 = gregorian;
  std::vector<double,_std::allocator<double>_>::vector(pvVar6,pvVar5);
  local_418[0] = CEDate::GregorianVect2JD((vector<double,_std::allocator<double>_> *)paVar4);
  paVar4 = &local_451;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"test_Gregorian",paVar4);
  local_458 = 0xa5;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,local_418,&local_400,local_450,&local_458);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffa00);
  std::vector<double,_std::allocator<double>_>::vector(pvVar6,pvVar5);
  local_460 = CEDate::GregorianVect2MJD(gregorian);
  this_00 = &local_499;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"test_Gregorian",this_00);
  local_4a0 = 0xa6;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_460,local_418 + 2,local_498,&local_4a0);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::vector<double,_std::allocator<double>_>::vector(pvVar6,pvVar5);
  local_4a8 = CEDate::GregorianVect2Gregorian((vector<double,_std::allocator<double>_> *)paVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"test_Gregorian",&local_4e1);
  local_4e8 = 0xa7;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_4a8,local_418 + 1,local_4e0,&local_4e8);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  bVar2 = (**(code **)(*(long *)in_RDI + 0x18))();
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  CEDate::~CEDate((CEDate *)0x11eb09);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  return (bool)(bVar2 & 1);
}

Assistant:

bool test_CEDate::test_Gregorian()
{
    test_date_.SetDate(base_date_.Gregorian(), CEDateType::GREGORIAN);
    test_double(test_date_.Gregorian(), base_date_.Gregorian(), __func__, __LINE__);

    // Test getting the year, month, day, and day fraction
    test_int(test_date_.Year(), base_date_.Year(), __func__, __LINE__);
    test_int(test_date_.Month(), base_date_.Month(), __func__, __LINE__);
    test_int(test_date_.Day(), base_date_.Day(), __func__, __LINE__);
    test_double(test_date_.DayFraction(), base_date_.DayFraction(), __func__, __LINE__);

    // Test getting the Gregorian date as a vector
    test_vect(test_date_.GregorianVect(), base_date_.GregorianVect(), __func__, __LINE__);

    // Test setting the date as a gregorian vector
    std::vector<double> greg_vec = base_date_.GregorianVect();
    CEDate test1;
    test(test1.JD() != base_date_.JD(), __func__, __LINE__);
    test1.SetDate(greg_vec);
    test_vect(test1.GregorianVect(), greg_vec, __func__, __LINE__);

    // Make sure that the returned errors of GregorianVect2JD are handled
    greg_vec                      = base_date_.GregorianVect();
    std::vector<double> greg_vec2 = greg_vec;
    // Test invalid year
    greg_vec2[0] = -50000;
    test_double(CEDate::GregorianVect2JD(greg_vec2), 0.0, __func__, __LINE__);
    greg_vec2 = greg_vec;
    // Test invalid month
    greg_vec2[1] = -1;
    test_double(CEDate::GregorianVect2JD(greg_vec2), 0.0, __func__, __LINE__);
    greg_vec2[1] = 13;
    test_double(CEDate::GregorianVect2JD(greg_vec2), 0.0, __func__, __LINE__);
    greg_vec2 = greg_vec;
    // Test date
    greg_vec2[2] += 100;
    test_double(CEDate::GregorianVect2JD(greg_vec2), base_date_.JD() + 100.0, __func__, __LINE__);

    // Test conversion of gregorian vector to JD, MJD, Gregorian date
    greg_vec = {2000, 01, 01, 0.5};
    double test_jd   = CppEphem::julian_date_J2000();
    double test_mjd  = test_jd - DJM0;
    double test_greg = 20000101.5;
    test_double(CEDate::GregorianVect2JD(greg_vec), test_jd, __func__, __LINE__);
    test_double(CEDate::GregorianVect2MJD(greg_vec), test_mjd, __func__, __LINE__);
    test_double(CEDate::GregorianVect2Gregorian(greg_vec), test_greg, __func__, __LINE__);

    return pass();
}